

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void Commands::DropItem(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Character *from)

{
  World *pWVar1;
  bool bVar2;
  short item_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  const_reference pvVar6;
  size_type sVar7;
  element_type *peVar8;
  mapped_type *this;
  double dVar9;
  double dVar10;
  uint local_ac;
  uint local_a8;
  int local_a4;
  undefined1 local_a0 [8];
  PacketBuilder reply;
  key_type local_68;
  undefined1 local_38 [8];
  shared_ptr<Map_Item> item;
  int y;
  int x;
  int amount;
  int id;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  if ((from->trading & 1U) == 0) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](arguments,0);
    iVar3 = util::to_int(pvVar6);
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(arguments);
    if (sVar7 < 2) {
      local_a4 = 1;
    }
    else {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](arguments,1);
      local_a4 = util::to_int(pvVar6);
    }
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(arguments);
    if (sVar7 < 3) {
      local_a8 = (uint)from->x;
    }
    else {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](arguments,2);
      local_a8 = util::to_int(pvVar6);
    }
    item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = local_a8
    ;
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(arguments);
    if (sVar7 < 4) {
      local_ac = (uint)from->y;
    }
    else {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](arguments,3);
      local_ac = util::to_int(pvVar6);
    }
    item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = local_ac
    ;
    if (0 < local_a4) {
      item_00 = (short)iVar3;
      iVar4 = Character::HasItem(from,item_00,false);
      if (local_a4 <= iVar4) {
        Map::AddItem((Map *)local_38,(short)from->map,(int)item_00,(uchar)local_a4,
                     (uchar)item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._4_4_,
                     (Character *)
                     (ulong)(byte)(uint)item.
                                        super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
        if (bVar2) {
          uVar5 = Character::PlayerID(from);
          peVar8 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
          peVar8->owner = uVar5;
          dVar9 = Timer::GetTime();
          pWVar1 = from->world;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"ProtectPlayerDrop",
                     (allocator<char> *)((long)&reply.add_size + 7));
          this = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_68);
          dVar10 = util::variant::operator_cast_to_double(this);
          peVar8 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
          peVar8->unprotecttime = dVar9 + dVar10;
          std::__cxx11::string::~string((string *)&local_68);
          std::allocator<char>::~allocator((allocator<char> *)((long)&reply.add_size + 7));
          Character::DelItem(from,item_00,local_a4);
          PacketBuilder::PacketBuilder((PacketBuilder *)local_a0,PACKET_ITEM,PACKET_DROP,0xf);
          PacketBuilder::AddShort((PacketBuilder *)local_a0,iVar3);
          PacketBuilder::AddThree((PacketBuilder *)local_a0,local_a4);
          iVar3 = Character::HasItem(from,item_00,false);
          PacketBuilder::AddInt((PacketBuilder *)local_a0,iVar3);
          peVar8 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
          PacketBuilder::AddShort((PacketBuilder *)local_a0,(int)peVar8->uid);
          PacketBuilder::AddChar
                    ((PacketBuilder *)local_a0,
                     item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     ._4_4_);
          PacketBuilder::AddChar
                    ((PacketBuilder *)local_a0,
                     (uint)item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi);
          PacketBuilder::AddChar((PacketBuilder *)local_a0,from->weight);
          PacketBuilder::AddChar((PacketBuilder *)local_a0,from->maxweight);
          Character::Send(from,(PacketBuilder *)local_a0);
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_a0);
        }
        std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_38);
      }
    }
  }
  return;
}

Assistant:

void DropItem(const std::vector<std::string>& arguments, Character* from)
{
	if (from->trading) return;

	int id = util::to_int(arguments[0]);
	int amount = (arguments.size() >= 2) ? util::to_int(arguments[1]) : 1;
	int x = (arguments.size() >= 3) ? util::to_int(arguments[2]) : from->x;
	int y = (arguments.size() >= 4) ? util::to_int(arguments[3]) : from->y;

	if (amount > 0 && from->HasItem(id) >= amount)
	{
		std::shared_ptr<Map_Item> item = from->map->AddItem(id, amount, x, y, from);

		if (item)
		{
			item->owner = from->PlayerID();
			item->unprotecttime = Timer::GetTime() + double(from->world->config["ProtectPlayerDrop"]);
			from->DelItem(id, amount);

			PacketBuilder reply(PACKET_ITEM, PACKET_DROP, 15);
			reply.AddShort(id);
			reply.AddThree(amount);
			reply.AddInt(from->HasItem(id));
			reply.AddShort(item->uid);
			reply.AddChar(x);
			reply.AddChar(y);
			reply.AddChar(from->weight);
			reply.AddChar(from->maxweight);
			from->Send(reply);
		}
	}
}